

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

shared_ptr<gui::Panel> __thiscall
gui::Panel::create(Panel *this,shared_ptr<gui::PanelStyle> *style,String *name)

{
  Panel *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::Panel> sVar1;
  __shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (Panel *)operator_new(0x220);
  std::__shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&style->super___shared_ptr<gui::PanelStyle,_(__gnu_cxx::_Lock_policy)2>);
  Panel(this_00,(shared_ptr<gui::PanelStyle> *)&local_40,name);
  std::__shared_ptr<gui::Panel,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<gui::Panel,void>
            ((__shared_ptr<gui::Panel,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Panel>)sVar1.super___shared_ptr<gui::Panel,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Panel> Panel::create(std::shared_ptr<PanelStyle> style, const sf::String& name) {
    return std::shared_ptr<Panel>(new Panel(style, name));
}